

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O0

float trng::math::detail::GammaPQ_asympt_R<float>(float a,float eta,float eta_squard_half)

{
  bool bVar1;
  float in_XMM0_Da;
  float fVar2;
  float fVar3;
  double dVar4;
  double dVar5;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float y_old;
  size_t i_1;
  float y;
  float eta_to_the_i;
  ptrdiff_t i;
  float beta [11];
  size_t n;
  GammaPQ_asympt_coefficients<float> coeffs;
  ulong local_60;
  float local_58;
  float local_54;
  long local_50;
  float afStack_48 [12];
  undefined8 local_18;
  float local_c;
  float local_8;
  float local_4;
  
  local_18 = 0xb;
  local_c = in_XMM2_Da;
  local_8 = in_XMM1_Da;
  local_4 = in_XMM0_Da;
  afStack_48[10] = GammaPQ_asympt_coefficients<float>::get(0xb);
  afStack_48[9] = GammaPQ_asympt_coefficients<float>::get(10);
  for (local_50 = 8; -1 < local_50; local_50 = local_50 + -1) {
    fVar2 = (afStack_48[local_50 + 2] * (float)(local_50 + 2)) / local_4;
    fVar3 = GammaPQ_asympt_coefficients<float>::get(local_50 + 1);
    afStack_48[local_50] = fVar2 + fVar3;
  }
  local_54 = 1.0;
  local_58 = 0.0;
  for (local_60 = 0; local_60 < 0xb; local_60 = local_60 + 1) {
    fVar2 = afStack_48[local_60] * local_54 + local_58;
    bVar1 = NAN(local_58);
    if ((fVar2 == local_58) && (local_58 = fVar2, !NAN(fVar2) && !bVar1)) break;
    local_54 = local_8 * local_54;
    local_58 = fVar2;
  }
  fVar2 = afStack_48[1] / local_4;
  dVar4 = std::exp((double)(ulong)(uint)(-local_4 * local_c));
  dVar5 = std::sqrt((double)(ulong)(uint)local_4);
  return (((local_58 / (fVar2 + 1.0)) * SUB84(dVar4,0)) / SUB84(dVar5,0)) * 0.3989423;
}

Assistant:

TRNG_CUDA_ENABLE T GammaPQ_asympt_R(T a, T eta, T eta_squard_half) {
        GammaPQ_asympt_coefficients<T> coeffs;
        constexpr std::size_t n{coeffs.max_index() - 1};
        T beta[n];
        beta[n - 1] = coeffs.get(n);
        beta[n - 2] = coeffs.get(n - 1);
        for (std::ptrdiff_t i{n - 3}; i >= 0; --i)
          beta[i] = beta[i + 2] * (i + 2) / a + coeffs.get(i + 1);
        T eta_to_the_i{1};
        T y{0};
        for (std::size_t i{0}; i < n; ++i) {
          const T y_old{y};
          y += beta[i] * eta_to_the_i;
          if (y == y_old)
            break;
          eta_to_the_i *= eta;
        }
        return y / (1 + beta[1] / a) * exp(-a * eta_squard_half) / sqrt(a) *
               constants<T>::one_over_sqrt_2pi;
      }